

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

double poisson_pq2s(pqpair pq,double lambda)

{
  double local_50;
  double bound;
  double xlam;
  double s;
  double q;
  double p;
  int status;
  int which;
  double lambda_local;
  pqpair pq_local;
  
  s = pq.q;
  q = pq.p;
  p._4_4_ = 2;
  xlam = 0.0;
  bound = lambda;
  _status = lambda;
  lambda_local = q;
  pq_local.p = s;
  cdfpoi((int *)((long)&p + 4),&q,&s,&xlam,&bound,(int *)&p,&local_50);
  return xlam;
}

Assistant:

static double poisson_pq2s( pqpair pq , double lambda )
{
   int which , status ;
   double p,q, s,xlam,bound ;

   which  = 2 ;
   p      = pq.p ;
   q      = pq.q ;
   s      = 0.0 ;
   xlam   = lambda ;

   cdfpoi( &which , &p , &q , &s , &xlam , &status , &bound ) ;
   return s ;
}